

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int gpioStoreScript(char *script)

{
  int *__ptr;
  int iVar1;
  pthread_t *ppVar2;
  int iVar3;
  long lVar4;
  cmdScript_t *s;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioStoreScript_cold_1();
  }
  if (libInitialised == '\0') {
    iVar3 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioStoreScript_cold_2();
    }
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&gpioStoreScript::mutex);
    iVar3 = 0;
    lVar4 = 0;
    do {
      if (*(int *)((long)&gpioScript[0].state + lVar4) == 0) {
        s = (cmdScript_t *)((long)&gpioScript[0].script.par + lVar4);
        *(undefined4 *)((long)&gpioScript[0].state + lVar4) = 1;
        pthread_mutex_unlock((pthread_mutex_t *)&gpioStoreScript::mutex);
        iVar1 = cmdParseScript(script,s,0);
        if (iVar1 != 0) {
          __ptr = s->par;
          if (__ptr != (int *)0x0) {
            free(__ptr);
          }
          *(undefined8 *)((long)&gpioScript[0].script.par + lVar4) = 0;
          *(undefined4 *)((long)&gpioScript[0].state + lVar4) = 0;
          return iVar1;
        }
        *(undefined8 *)((long)&gpioScript[0].request + lVar4) = 0;
        pthread_cond_init((pthread_cond_t *)((long)&gpioScript[0].pthCond + lVar4),
                          (pthread_condattr_t *)0x0);
        pthread_mutex_init((pthread_mutex_t *)((long)&gpioScript[0].pthMutex + lVar4),
                           (pthread_mutexattr_t *)0x0);
        *(int *)((long)&gpioScript[0].id + lVar4) = iVar3;
        *(undefined4 *)((long)&gpioScript[0].state + lVar4) = 2;
        ppVar2 = gpioStartThread(pthScript,(void *)((long)&gpioScript[0].id + lVar4));
        *(pthread_t **)((long)&gpioScript[0].pthIdp + lVar4) = ppVar2;
        return iVar3;
      }
      lVar4 = lVar4 + 0xb0;
      iVar3 = iVar3 + 1;
    } while (lVar4 != 0x1600);
    pthread_mutex_unlock((pthread_mutex_t *)&gpioStoreScript::mutex);
    iVar3 = -0x39;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioStoreScript_cold_3();
    }
  }
  return iVar3;
}

Assistant:

int gpioStoreScript(char *script)
{
   static pthread_mutex_t mutex = PTHREAD_MUTEX_INITIALIZER;
   gpioScript_t *s;
   int status, slot, i;

   DBG(DBG_USER, "script=[%s]", script);

   CHECK_INITED;

   slot = -1;

   pthread_mutex_lock(&mutex);

   for (i=0; i<PI_MAX_SCRIPTS; i++)
   {
      if (gpioScript[i].state == PI_SCRIPT_FREE)
      {
         slot = i;
         gpioScript[slot].state = PI_SCRIPT_RESERVED;
         break;
      }
   }

   pthread_mutex_unlock(&mutex);

   if (slot < 0) SOFT_ERROR(PI_NO_SCRIPT_ROOM, "no room for scripts");

   s = &gpioScript[slot];

   status = cmdParseScript(script, &s->script, 0);

   if (status == 0)
   {
      s->request   = PI_SCRIPT_HALT;
      s->run_state = PI_SCRIPT_INITING;

      pthread_cond_init(&s->pthCond, NULL);
      pthread_mutex_init(&s->pthMutex, NULL);

      s->id = slot;

      gpioScript[slot].state = PI_SCRIPT_IN_USE;

      s->pthIdp = gpioStartThread(pthScript, s);

      status = slot;
   }
   else
   {
      if (s->script.par) free(s->script.par);
      s->script.par = NULL;
      gpioScript[slot].state = PI_SCRIPT_FREE;
   }

   return status;
}